

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parasail_aligner.cpp
# Opt level: O1

void process(unsigned_long *count_generated,PairSet *pairs,quad *q,int *SA,uchar *BWT,int *SID,
            vector<int,_std::allocator<int>_> *DB,char *sentinal,int *cutoff)

{
  pointer pqVar1;
  pointer pqVar2;
  bool bVar3;
  int iVar4;
  int j;
  uint local_74;
  ulong local_70;
  ulong local_68;
  uint local_5c;
  PairSet *local_58;
  int *local_50;
  uchar *local_48;
  int *local_40;
  ulong local_38;
  
  if (*cutoff <= q->lcp) {
    pqVar1 = (q->children).super__Vector_base<quad,_std::allocator<quad>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pqVar2 = (q->children).super__Vector_base<quad,_std::allocator<quad>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_58 = pairs;
    local_50 = SA;
    local_48 = BWT;
    local_40 = SID;
    if (pqVar1 == pqVar2) {
      local_74 = q->lb;
      if ((int)local_74 <= q->rb) {
        do {
          local_70 = (ulong)local_74;
          iVar4 = local_74 + 1;
          local_68 = CONCAT44(local_68._4_4_,iVar4);
          if ((int)local_74 < q->rb) {
            do {
              j = iVar4;
              pair_check(count_generated,local_58,(int *)&local_74,&j,SA,local_48,SID,DB,sentinal);
              bVar3 = iVar4 < q->rb;
              SA = local_50;
              SID = local_40;
              iVar4 = iVar4 + 1;
            } while (bVar3);
          }
          local_74 = (uint)local_68;
        } while ((int)local_70 < q->rb);
      }
    }
    else {
      local_74 = q->lb;
      if ((int)local_74 <= q->rb) {
        local_38 = ((long)pqVar1 - (long)pqVar2 >> 3) * -0x3333333333333333;
        local_70 = 0;
        do {
          local_68 = (ulong)local_74;
          local_5c = local_74 + 1;
          j = local_5c;
          if ((local_70 < local_38) &&
             (pqVar1 = (q->children).super__Vector_base<quad,_std::allocator<quad>_>._M_impl.
                       super__Vector_impl_data._M_start, pqVar1[local_70].lb <= (int)local_74)) {
            iVar4 = pqVar1[local_70].rb;
            j = iVar4 + 1;
            local_70 = local_70 + (iVar4 <= (int)local_74);
          }
          if (j <= q->rb) {
            iVar4 = j + -1;
            do {
              pair_check(count_generated,local_58,(int *)&local_74,&j,SA,local_48,SID,DB,sentinal);
              j = iVar4 + 2;
              iVar4 = iVar4 + 1;
              SA = local_50;
              SID = local_40;
            } while (iVar4 < q->rb);
          }
          local_74 = local_5c;
        } while ((int)local_68 < q->rb);
      }
    }
  }
  return;
}

Assistant:

inline static void process(
        unsigned long &count_generated,
        PairSet &pairs,
        const quad &q,
        const int * const restrict SA,
        const unsigned char * const restrict BWT,
        const int * const restrict SID,
        const vector<int> &DB,
        const char &sentinal,
        const int &cutoff)
{
    const size_t n_children = q.children.size();
    size_t child_index = 0;

    if (q.lcp < cutoff) return;

    if (n_children) {
        for (int i=q.lb; i<=q.rb; ++i) {
            int j = i+1;
            if (child_index < n_children) {
                if (i >= q.children[child_index].lb) {
                    j = q.children[child_index].rb+1;
                    if (i >= q.children[child_index].rb) {
                        ++child_index;
                    }
                }
            }
            for (/*nope*/; j<=q.rb; ++j) {
                pair_check(count_generated, pairs, i, j, SA, BWT, SID, DB, sentinal);
            }
        }
    }
    else {
        for (int i=q.lb; i<=q.rb; ++i) {
            for (int j=i+1; j<=q.rb; ++j) {
                pair_check(count_generated, pairs, i, j, SA, BWT, SID, DB, sentinal);
            }
        }
    }
}